

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O3

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultSchema
          (string *__return_storage_ptr__,CatalogSearchPath *this,string *catalog)

{
  pointer pCVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  pointer l1;
  
  l1 = (this->paths).
       super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->paths).
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (l1 == pCVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"main","");
      return __return_storage_ptr__;
    }
    iVar4 = ::std::__cxx11::string::compare((char *)l1);
    if ((iVar4 != 0) && (bVar3 = StringUtil::CIEquals(&l1->catalog,catalog), bVar3)) break;
    l1 = l1 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (l1->schema)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (l1->schema)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchPath::GetDefaultSchema(const string &catalog) const {
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.catalog, catalog)) {
			return path.schema;
		}
	}
	return DEFAULT_SCHEMA;
}